

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

bool __thiscall
pybind11::detail::
list_caster<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::load(list_caster<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,handle src,bool convert)

{
  object *__args;
  handle hVar1;
  bool bVar2;
  bool bVar3;
  PyObject *pPVar4;
  sequence_iterator sVar5;
  reference it;
  value_conv conv;
  handle local_40;
  handle local_38;
  sequence s;
  
  bVar2 = sequence::check_(src);
  if (bVar2) {
    if (src.m_ptr == (PyObject *)0x0) {
      local_38.m_ptr = (PyObject *)0x0;
    }
    else {
      if (((src.m_ptr)->ob_type->tp_flags & 0x18000000) != 0) goto LAB_00336f64;
      (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
      local_38.m_ptr = src.m_ptr;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->value);
    reserve_maybe<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
              (this,(sequence *)&local_38,&this->value);
    hVar1.m_ptr = local_38.m_ptr;
    sVar5 = sequence::end((sequence *)&local_38);
    conv.
    super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    .value.field_2._8_8_ = sVar5.super_sequence_slow_readwrite.index;
    __args = &it.cache;
    for (pPVar4 = (PyObject *)0x0;
        bVar2 = (PyObject *)
                conv.
                super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                .value.field_2._8_8_ == pPVar4, !bVar2;
        pPVar4 = (PyObject *)((long)&pPVar4->ob_refcnt + 1)) {
      it._0_8_ = hVar1.m_ptr;
      it.key = 0;
      it.cache.super_handle.m_ptr =
           (handle)&conv.
                    super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    .value._M_string_length;
      conv.
      super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      .value._M_dataplus._M_p = (pointer)0x0;
      conv.
      super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      .value._M_string_length._0_1_ = 0;
      it.obj.m_ptr = pPVar4;
      accessor::operator_cast_to_object((accessor *)&local_40);
      bVar3 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      *)__args,local_40,convert);
      object::~object((object *)&local_40);
      if (!bVar3) {
        std::__cxx11::string::~string((string *)&it.cache);
        object::~object((object *)&it.key);
        break;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
      std::__cxx11::string::~string((string *)__args);
      object::~object((object *)&it.key);
    }
    object::~object((object *)&local_38);
  }
  else {
LAB_00336f64:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<bytes>(src) || isinstance<str>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }